

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  ExtensionSet *local_48;
  KeyValue *it;
  ExtensionSet *pEStack_18;
  int key_local;
  ExtensionSet *this_local;
  
  if (this->flat_size_ == 0) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    it._4_4_ = key;
    pEStack_18 = this;
    bVar1 = is_large(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = (ExtensionSet *)FindOrNullInLargeMap(this,it._4_4_);
    }
    else {
      pKVar2 = flat_begin(this);
      pKVar3 = flat_end(this);
      pKVar2 = std::
               lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                         (pKVar2,pKVar3 + -1,(long)&it + 4);
      if (pKVar2->first == it._4_4_) {
        local_48 = (ExtensionSet *)&pKVar2->second;
      }
      else {
        local_48 = (ExtensionSet *)0x0;
      }
      this_local = local_48;
    }
  }
  return (Extension *)this_local;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    auto it = std::lower_bound(flat_begin(), flat_end() - 1, key,
                               KeyValue::FirstComparator());
    return it->first == key ? &it->second : nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}